

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O2

void __thiscall Minisat::Solver::simplifyLearnt<Minisat::Clause>(Solver *this,Clause *c)

{
  uint64_t *puVar1;
  int iVar2;
  anon_struct_8_10_eb538618_for_header aVar3;
  Lit *pLVar4;
  bool bVar5;
  CRef confl;
  uint64_t uVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  lbool local_6a;
  lbool local_69;
  vec<Minisat::Lit> *local_68;
  ulong local_60;
  vec<unsigned_int> *local_58;
  ulong local_50;
  ulong local_48;
  Clause *local_40;
  ulong local_38;
  
  this->original_length_record = this->original_length_record + ((ulong)c->header >> 0x22);
  this->trailRecord = (this->trail).sz;
  aVar3 = c->header;
  this->LCM_total_tries = this->LCM_total_tries + 1;
  local_50 = (ulong)aVar3 >> 0x22;
  local_40 = c + 1;
  local_68 = &this->simp_learnt_clause;
  local_58 = &this->simp_reason_clause;
  local_48 = 0;
  local_60 = 0;
  uVar9 = 0;
  while (uVar9 < (ulong)this->reverse_LCM + 1) {
    puVar1 = &(this->statistics).solveSteps;
    *puVar1 = *puVar1 + 1;
    local_38 = uVar9;
    if (uVar9 != 0) {
      if (SUB84(c->header,4) >> 2 == 1) break;
      Clause::reverse(c);
      local_60 = local_60 ^ 1;
      local_48 = (ulong)c->header >> 0x22;
    }
    newDecisionLevel(this);
    iVar10 = 0;
    for (uVar9 = 0; uVar9 < (ulong)c->header >> 0x22; uVar9 = uVar9 + 1) {
      iVar2 = *(int *)(&c[1].header.field_0x0 + uVar9 * 4);
      local_69.value = (byte)iVar2 & 1 ^ (this->assigns).data[iVar2 >> 1].value;
      bVar5 = lbool::operator==(&local_69,(lbool)0x2);
      lVar7 = (long)iVar10;
      if (bVar5) {
        simpleUncheckEnqueue
                  (this,(Lit)(*(uint *)(&c[1].header.field_0x0 + uVar9 * 4) ^ 1),0xffffffff);
        iVar10 = iVar10 + 1;
        *(undefined4 *)(&c[1].header.field_0x0 + lVar7 * 4) =
             *(undefined4 *)(&c[1].header.field_0x0 + uVar9 * 4);
        confl = simplePropagate(this);
        if (confl != 0xffffffff) {
          bVar5 = false;
          goto LAB_0011db44;
        }
      }
      else {
        iVar2 = *(int *)(&c[1].header.field_0x0 + uVar9 * 4);
        local_6a.value = (byte)iVar2 & 1 ^ (this->assigns).data[iVar2 >> 1].value;
        bVar5 = lbool::operator==(&local_6a,(lbool)0x0);
        if (bVar5) {
          iVar10 = iVar10 + 1;
          iVar2 = *(int *)(&c[1].header.field_0x0 + uVar9 * 4);
          *(int *)(&c[1].header.field_0x0 + lVar7 * 4) = iVar2;
          confl = (this->vardata).data[iVar2 >> 1].reason;
          bVar5 = true;
          goto LAB_0011db44;
        }
      }
    }
    bVar5 = false;
    confl = 0xffffffff;
LAB_0011db44:
    Clause::shrink(c,(SUB84(c->header,4) >> 2) - iVar10);
    if (!(bool)(confl == 0xffffffff & (bVar5 ^ 1U))) {
      if (local_68->data != (Lit *)0x0) {
        (this->simp_learnt_clause).sz = 0;
      }
      if (local_58->data != (uint *)0x0) {
        (this->simp_reason_clause).sz = 0;
      }
      if (bVar5 != false) {
        vec<Minisat::Lit>::push
                  (local_68,(Lit *)((long)local_40 + ((ulong)c->header >> 0x22) * 4 + -4));
      }
      simpleAnalyze(this,confl,local_68,local_58,bVar5);
      iVar10 = (this->simp_learnt_clause).sz;
      uVar8 = SUB84(c->header,4) >> 2;
      if (iVar10 < (int)uVar8) {
        pLVar4 = local_68->data;
        for (lVar7 = 0; lVar7 < iVar10; lVar7 = lVar7 + 1) {
          *(int *)(&c[1].header.field_0x0 + lVar7 * 4) = pLVar4[lVar7].x;
          iVar10 = (this->simp_learnt_clause).sz;
        }
        Clause::shrink(c,uVar8 - (int)lVar7);
      }
    }
    cancelUntil(this,0,false);
    cancelUntilTrailRecord(this);
    this->simplified_length_record = this->simplified_length_record + ((ulong)c->header >> 0x22);
    aVar3 = c->header;
    if (((ulong)aVar3 >> 0x23 == 0) || ((uint)local_50 == aVar3._4_4_ >> 2)) break;
    this->LCM_dropped_lits = this->LCM_dropped_lits + (local_50 - ((ulong)aVar3 >> 0x22));
    uVar6 = this->LCM_dropped_reverse;
    if (local_38 != 0) {
      uVar6 = uVar6 + (long)(int)((int)local_48 - (SUB84(c->header,4) >> 2));
    }
    this->LCM_dropped_reverse = uVar6;
    uVar9 = local_38 + 1;
  }
  uVar9 = local_50;
  if ((local_60 & 1) != 0) {
    Clause::reverse(c);
  }
  this->LCM_successful_tries =
       this->LCM_successful_tries + (ulong)((uint)uVar9 != SUB84(c->header,4) >> 2);
  return;
}

Assistant:

inline void Solver::simplifyLearnt(C &c)
{
    ////
    original_length_record += c.size();

    trailRecord = trail.size(); // record the start pointer

    bool True_confl = false, reversed = false;
    int beforeSize = c.size(), preReserve = 0;
    int i, j;
    CRef confl = CRef_Undef;

    LCM_total_tries++;

    TRACE(std::cout << "c start simplifying clause " << c << std::endl);

    // try to simplify in reverse order, in case original succeeds
    for (size_t iteration = 0; iteration < (reverse_LCM ? 2 : 1); ++iteration) {
        True_confl = false;
        confl = CRef_Undef;
        statistics.solveSteps++;
        // reorder the current clause for next iteration?
        // (only useful if size changed in first iteration)
        if (iteration > 0) {
            if (c.size() == 1) break;
            c.reverse();
            reversed = !reversed;
            preReserve = c.size();
        }

        assert(decisionLevel() == 0 && "only run simplification on level 0");
        newDecisionLevel();
        assert(decisionLevel() == 1 && "only run simplification on level 0");

        for (i = 0, j = 0; i < c.size(); i++) {
            if (value(c[i]) == l_Undef) {
                // printf("///@@@ uncheckedEnqueue:index = %d. l_Undef\n", i);
                simpleUncheckEnqueue(~c[i]);
                c[j++] = c[i];
                confl = simplePropagate();
                if (confl != CRef_Undef) {
                    break;
                }
            } else {
                if (value(c[i]) == l_True) {
                    // printf("///@@@ uncheckedEnqueue:index = %d. l_True\n", i);
                    c[j++] = c[i];
                    True_confl = true;
                    confl = reason(var(c[i]));
                    break;
                } else {
                    // printf("///@@@ uncheckedEnqueue:index = %d. l_False\n", i);
                }
            }
        }
        TRACE(if (c.size() - j > 0) {
            std::cout << "c shrink clause after propagation to " << c << " (dropping last " << c.size() - j
                      << " literals, reverse=" << reversed << ")" << std::endl;
        });
        c.shrink(c.size() - j);

        if (confl != CRef_Undef || True_confl == true) {
            simp_learnt_clause.clear();
            simp_reason_clause.clear();
            if (True_confl == true) {
                simp_learnt_clause.push(c.last());
            }
            simpleAnalyze(confl, simp_learnt_clause, simp_reason_clause, True_confl);

            if (simp_learnt_clause.size() < c.size()) {
                for (i = 0; i < simp_learnt_clause.size(); i++) {
                    c[i] = simp_learnt_clause[i];
                }
                TRACE(if (c.size() - i > 0) {
                    std::cout << "c shrink clause after analysis to " << c << " (dropping last " << c.size() - i
                              << " literals, reverse=" << reversed << ")" << std::endl;
                });
                c.shrink(c.size() - i);
            }
        }

        assert(decisionLevel() == 1);
        cancelUntil(0);
        cancelUntilTrailRecord();
        assert(decisionLevel() == 0);

        ////
        simplified_length_record += c.size();

        // printf("\nbefore : %d, after : %d ", beforeSize, afterSize);
        if (beforeSize == c.size() || c.size() <= 1) break;
        TRACE(std::cout << "c simplified clause to " << c << " (before size: " << beforeSize << ")" << std::endl);
        LCM_dropped_lits += (beforeSize - c.size());
        LCM_dropped_reverse = iteration == 0 ? LCM_dropped_reverse : LCM_dropped_reverse + (preReserve - c.size());
    }

    // make sure the original order is restored, in case we resorted
    if (reversed) c.reverse();

    LCM_successful_tries = beforeSize == c.size() ? LCM_successful_tries : LCM_successful_tries + 1;
}